

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestCoverageHandler::FindLCovFiles
          (cmCTestCoverageHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *r;
  cmAlphaNum local_2a8;
  string daGlob;
  string buildDir;
  cmWorkingDirectory workdir;
  ostringstream cmCTestLog_msg;
  string local_98;
  Glob gl;
  
  cmsys::Glob::Glob(&gl);
  gl.Recurse = false;
  gl.RecurseThroughSymlinks = false;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"BuildDirectory",(allocator<char> *)&local_2a8);
  cmCTest::GetCTestConfiguration(&buildDir,pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  cmWorkingDirectory::cmWorkingDirectory(&workdir,&buildDir);
  if (workdir.ResultCode == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"profmerge",(allocator<char> *)&local_2a8);
    bVar2 = cmSystemTools::RunSingleCommand
                      ((string *)&cmCTestLog_msg,(string *)0x0,(string *)0x0,(int *)0x0,(char *)0x0,
                       OUTPUT_MERGE,(cmDuration)0x0);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    if (bVar2) {
      daGlob._M_dataplus._M_p = (pointer)&daGlob.field_2;
      daGlob._M_string_length = 0;
      daGlob.field_2._M_local_buf[0] = '\0';
      _cmCTestLog_msg = (pointer)buildDir._M_string_length;
      local_2a8.View_._M_len = (size_t)&DAT_00000006;
      local_2a8.View_._M_str = "/*.dpi";
      cmStrCat<>(&local_98,(cmAlphaNum *)&cmCTestLog_msg,&local_2a8);
      std::__cxx11::string::operator=((string *)&daGlob,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"   looking for dpi files in: ");
      poVar3 = std::operator<<(poVar3,(string *)&daGlob);
      std::endl<char,std::char_traits<char>>(poVar3);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x66d,(char *)local_2a8.View_._M_len,(this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      bVar2 = cmsys::Glob::FindFiles(&gl,&daGlob,(GlobMessages *)0x0);
      if (bVar2) {
        r = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
        ::cm::
        append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                  (files,r);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Now searching in: ");
        poVar3 = std::operator<<(poVar3,(string *)&daGlob);
        std::endl<char,std::char_traits<char>>(poVar3);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x675,(char *)local_2a8.View_._M_len,(this->super_cmCTestGenericHandler).Quiet
                    );
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Error while finding files matching ");
        poVar3 = std::operator<<(poVar3,(string *)&daGlob);
        std::endl<char,std::char_traits<char>>(poVar3);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x670,(char *)local_2a8.View_._M_len,false);
      }
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&daGlob);
      goto LAB_0017c92f;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::operator<<((ostream *)&cmCTestLog_msg,"Error while running profmerge.\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x664,(char *)local_2a8.View_._M_len,false);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Unable to change working directory to ");
    poVar3 = std::operator<<(poVar3,(string *)&buildDir);
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x65e,(char *)local_2a8.View_._M_len,false);
  }
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  bVar2 = false;
LAB_0017c92f:
  cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  std::__cxx11::string::~string((string *)&buildDir);
  cmsys::Glob::~Glob(&gl);
  return bVar2;
}

Assistant:

bool cmCTestCoverageHandler::FindLCovFiles(std::vector<std::string>& files)
{
  cmsys::Glob gl;
  gl.RecurseOff(); // No need of recurse if -prof_dir${BUILD_DIR} flag is
                   // used while compiling.
  gl.RecurseThroughSymlinksOff();
  std::string buildDir = this->CTest->GetCTestConfiguration("BuildDirectory");
  cmWorkingDirectory workdir(buildDir);
  if (workdir.Failed()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Unable to change working directory to " << buildDir
                                                        << std::endl);
    return false;
  }

  // Run profmerge to merge all *.dyn files into dpi files
  if (!cmSystemTools::RunSingleCommand("profmerge")) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Error while running profmerge.\n");
    return false;
  }

  // DPI file should appear in build directory
  std::string daGlob;
  daGlob = cmStrCat(buildDir, "/*.dpi");
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "   looking for dpi files in: " << daGlob << std::endl,
                     this->Quiet);
  if (!gl.FindFiles(daGlob)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error while finding files matching " << daGlob << std::endl);
    return false;
  }
  cm::append(files, gl.GetFiles());
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Now searching in: " << daGlob << std::endl, this->Quiet);
  return true;
}